

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O2

float __thiscall
deqp::gles3::Functional::Vertex3DTextureCase::calculateLod
          (Vertex3DTextureCase *this,Mat3 *transf,Vec2 *dstSize,int textureNdx)

{
  Texture3D *pTVar1;
  uint uVar2;
  float fVar3;
  float fVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  Vec3 trans10;
  Vec3 trans01;
  Vec3 trans00;
  Vector<float,_3> local_98;
  Vector<float,_3> local_88;
  float local_78;
  float local_68;
  float local_58;
  Vector<float,_3> local_48;
  float local_3c;
  float local_38;
  float local_34;
  
  pTVar1 = this->m_textures[textureNdx];
  local_78 = (float)(pTVar1->m_refTexture).m_width;
  local_68 = (float)(pTVar1->m_refTexture).m_height;
  local_58 = (float)(pTVar1->m_refTexture).m_depth;
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = 0.0;
  local_88.m_data[2] = 1.0;
  tcu::operator*((tcu *)&local_3c,transf,&local_88);
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 1.0;
  local_98.m_data[2] = 1.0;
  tcu::operator*((tcu *)&local_88,transf,&local_98);
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 1.0;
  tcu::operator*((tcu *)&local_98,transf,&local_48);
  auVar8._0_4_ = local_78 * (local_98.m_data[0] - local_3c);
  auVar8._4_4_ = local_78 * (local_88.m_data[0] - local_3c);
  auVar8._8_4_ = local_78 * (0.0 - local_3c);
  auVar8._12_4_ = local_78 * (0.0 - local_3c);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)dstSize->m_data;
  auVar8 = divps(auVar8,auVar6);
  auVar4._0_4_ = local_68 * (local_98.m_data[1] - local_38);
  auVar4._4_4_ = local_68 * (local_88.m_data[1] - local_38);
  auVar4._8_4_ = local_68 * (0.0 - local_38);
  auVar4._12_4_ = local_68 * (0.0 - local_38);
  auVar4 = divps(auVar4,auVar6);
  auVar5._0_4_ = local_58 * (local_98.m_data[2] - local_34);
  auVar5._4_4_ = local_58 * (local_88.m_data[2] - local_34);
  auVar5._8_4_ = local_58 * (0.0 - local_34);
  auVar5._12_4_ = local_58 * (0.0 - local_34);
  auVar6 = divps(auVar5,auVar6);
  fVar3 = auVar6._0_4_ * auVar6._0_4_ + auVar8._0_4_ * auVar8._0_4_ + auVar4._0_4_ * auVar4._0_4_;
  fVar7 = auVar6._4_4_ * auVar6._4_4_ + auVar8._4_4_ * auVar8._4_4_ + auVar4._4_4_ * auVar4._4_4_;
  uVar2 = -(uint)(fVar7 <= fVar3);
  fVar3 = deFloatLog2(SQRT((float)(~uVar2 & (uint)fVar7 | (uint)fVar3 & uVar2)));
  return fVar3;
}

Assistant:

float Vertex3DTextureCase::calculateLod (const Mat3& transf, const Vec2& dstSize, int textureNdx) const
{
	const tcu::Texture3D&	refTexture	= m_textures[textureNdx]->getRefTexture();
	const int				srcWidth	= refTexture.getWidth();
	const int				srcHeight	= refTexture.getHeight();
	const int				srcDepth	= refTexture.getDepth();

	// Calculate transformed coordinates of three screen corners.
	const Vec3				trans00		= transf * Vec3(0.0f, 0.0f, 1.0f);
	const Vec3				trans01		= transf * Vec3(0.0f, 1.0f, 1.0f);
	const Vec3				trans10		= transf * Vec3(1.0f, 0.0f, 1.0f);

	// Derivates.
	const float dudx = (trans10.x() - trans00.x()) * (float)srcWidth / dstSize.x();
	const float dudy = (trans01.x() - trans00.x()) * (float)srcWidth / dstSize.y();
	const float dvdx = (trans10.y() - trans00.y()) * (float)srcHeight / dstSize.x();
	const float dvdy = (trans01.y() - trans00.y()) * (float)srcHeight / dstSize.y();
	const float dwdx = (trans10.z() - trans00.z()) * (float)srcDepth / dstSize.x();
	const float dwdy = (trans01.z() - trans00.z()) * (float)srcDepth / dstSize.y();

	return deFloatLog2(deFloatSqrt(de::max(dudx*dudx + dvdx*dvdx + dwdx*dwdx, dudy*dudy + dvdy*dvdy + dwdy*dwdy)));
}